

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmNtk.c
# Opt level: O2

void Sfm_NtkAddFanin(Sfm_Ntk_t *p,int iNode,int iFanin)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  
  if (iFanin < 0) {
    return;
  }
  if (p->nPis <= iNode) {
    if (p->nPos + iNode < p->nObjs) {
      if (p->nObjs <= p->nPos + iFanin) {
        __assert_fail("!Sfm_ObjIsPo(p, iFanin)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmNtk.c"
                      ,0x112,"void Sfm_NtkAddFanin(Sfm_Ntk_t *, int, int)");
      }
      pVVar2 = Vec_WecEntry(&p->vFanins,iNode);
      iVar1 = Vec_IntFind(pVVar2,iFanin);
      if (iVar1 == -1) {
        pVVar2 = Vec_WecEntry(&p->vFanouts,iFanin);
        iVar1 = Vec_IntFind(pVVar2,iNode);
        if (iVar1 == -1) {
          pVVar2 = Vec_WecEntry(&p->vFanins,iNode);
          Vec_IntPush(pVVar2,iFanin);
          pVVar2 = Vec_WecEntry(&p->vFanouts,iFanin);
          Vec_IntPush(pVVar2,iNode);
          return;
        }
        __assert_fail("Vec_IntFind( Sfm_ObjFoArray(p, iFanin), iNode ) == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmNtk.c"
                      ,0x114,"void Sfm_NtkAddFanin(Sfm_Ntk_t *, int, int)");
      }
      __assert_fail("Vec_IntFind( Sfm_ObjFiArray(p, iNode), iFanin ) == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmNtk.c"
                    ,0x113,"void Sfm_NtkAddFanin(Sfm_Ntk_t *, int, int)");
    }
  }
  __assert_fail("Sfm_ObjIsNode(p, iNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmNtk.c"
                ,0x111,"void Sfm_NtkAddFanin(Sfm_Ntk_t *, int, int)");
}

Assistant:

void Sfm_NtkAddFanin( Sfm_Ntk_t * p, int iNode, int iFanin )
{
    if ( iFanin < 0 )
        return;
    assert( Sfm_ObjIsNode(p, iNode) );
    assert( !Sfm_ObjIsPo(p, iFanin) );
    assert( Vec_IntFind( Sfm_ObjFiArray(p, iNode), iFanin ) == -1 );
    assert( Vec_IntFind( Sfm_ObjFoArray(p, iFanin), iNode ) == -1 );
    Vec_IntPush( Sfm_ObjFiArray(p, iNode), iFanin );
    Vec_IntPush( Sfm_ObjFoArray(p, iFanin), iNode );
}